

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O0

int ccm_calculate_first_block_if_ready(mbedtls_ccm_context *ctx)

{
  size_t local_30;
  size_t olen;
  size_t len_left;
  uchar i;
  mbedtls_ccm_context *pmStack_18;
  int ret;
  mbedtls_ccm_context *ctx_local;
  
  len_left._4_4_ = 0xffffff92;
  if (((ctx->state & 1U) == 0) || ((ctx->state & 2U) == 0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    if (ctx->tag_len == 0) {
      if ((ctx->mode != 3) && (ctx->mode != 2)) {
        return -0xd;
      }
      ctx->plaintext_len = 0;
    }
    ctx->y[0] = ctx->y[0] | (ctx->add_len != 0) << 6;
    ctx->y[0] = ctx->y[0] | (byte)((ctx->tag_len - 2 >> 1) << 3);
    ctx->y[0] = ctx->y[0] | (char)ctx->q - 1U;
    len_left._3_1_ = 0;
    olen = ctx->plaintext_len;
    for (; (uint)len_left._3_1_ < ctx->q; len_left._3_1_ = len_left._3_1_ + 1) {
      ctx->y[(int)(0xf - (uint)len_left._3_1_)] = (uchar)olen;
      olen = olen >> 8;
    }
    if (olen == 0) {
      pmStack_18 = ctx;
      ctx_local._4_4_ = mbedtls_cipher_update(&ctx->cipher_ctx,ctx->y,0x10,ctx->y,&local_30);
      if (ctx_local._4_4_ == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        pmStack_18->state = pmStack_18->state | 0x10;
      }
    }
    else {
      ctx->state = ctx->state | 0x10;
      ctx_local._4_4_ = -0xd;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int ccm_calculate_first_block_if_ready(mbedtls_ccm_context *ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char i;
    size_t len_left, olen;

    /* length calculation can be done only after both
     * mbedtls_ccm_starts() and mbedtls_ccm_set_lengths() have been executed
     */
    if (!(ctx->state & CCM_STATE__STARTED) || !(ctx->state & CCM_STATE__LENGTHS_SET)) {
        return 0;
    }

    /* CCM expects non-empty tag.
     * CCM* allows empty tag. For CCM* without tag, ignore plaintext length.
     */
    if (ctx->tag_len == 0) {
        if (ctx->mode == MBEDTLS_CCM_STAR_ENCRYPT || ctx->mode == MBEDTLS_CCM_STAR_DECRYPT) {
            ctx->plaintext_len = 0;
        } else {
            return MBEDTLS_ERR_CCM_BAD_INPUT;
        }
    }

    /*
     * First block:
     * 0        .. 0        flags
     * 1        .. iv_len   nonce (aka iv)  - set by: mbedtls_ccm_starts()
     * iv_len+1 .. 15       length
     *
     * With flags as (bits):
     * 7        0
     * 6        add present?
     * 5 .. 3   (t - 2) / 2
     * 2 .. 0   q - 1
     */
    ctx->y[0] |= (ctx->add_len > 0) << 6;
    ctx->y[0] |= ((ctx->tag_len - 2) / 2) << 3;
    ctx->y[0] |= ctx->q - 1;

    for (i = 0, len_left = ctx->plaintext_len; i < ctx->q; i++, len_left >>= 8) {
        ctx->y[15-i] = MBEDTLS_BYTE_0(len_left);
    }

    if (len_left > 0) {
        ctx->state |= CCM_STATE__ERROR;
        return MBEDTLS_ERR_CCM_BAD_INPUT;
    }

    /* Start CBC-MAC with first block*/
    if ((ret = mbedtls_cipher_update(&ctx->cipher_ctx, ctx->y, 16, ctx->y, &olen)) != 0) {
        ctx->state |= CCM_STATE__ERROR;
        return ret;
    }

    return 0;
}